

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::Prog::ComputeByteMap(Prog *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  InstOp IVar4;
  int iVar5;
  EmptyOp EVar6;
  Inst *this_00;
  const_iterator pbVar7;
  Prog *in_RDI;
  int i;
  int j;
  bool isword;
  const_iterator __end5;
  const_iterator __begin5;
  initializer_list<bool> *__range5;
  int foldhi;
  int foldlo;
  int hi;
  int lo;
  Inst *ip;
  int id;
  bool marked_word_boundaries;
  bool marked_line_boundaries;
  ByteMapBuilder builder;
  int in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffacc;
  uint in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad4;
  undefined1 in_stack_fffffffffffffad5;
  undefined1 in_stack_fffffffffffffad6;
  undefined1 in_stack_fffffffffffffad7;
  InstOp in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffae4;
  Inst *in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaf0;
  InstOp in_stack_fffffffffffffaf4;
  undefined4 in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb04;
  int local_4cc;
  int local_4c8;
  const_iterator local_4b8;
  bool local_4aa [2];
  initializer_list<bool> local_4a8;
  initializer_list<bool> *local_498;
  int local_490;
  int local_48c;
  int local_488;
  int local_484;
  Inst *local_480;
  int local_468;
  byte local_462;
  byte local_461;
  
  ByteMapBuilder::ByteMapBuilder
            ((ByteMapBuilder *)
             CONCAT17(in_stack_fffffffffffffad7,
                      CONCAT16(in_stack_fffffffffffffad6,
                               CONCAT15(in_stack_fffffffffffffad5,
                                        CONCAT14(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0
                                                )))));
  local_461 = 0;
  local_462 = 0;
  local_468 = 0;
  do {
    iVar5 = local_468;
    iVar3 = size(in_RDI);
    if (iVar3 <= iVar5) {
      ByteMapBuilder::Build
                ((ByteMapBuilder *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                 (uint8_t *)in_stack_fffffffffffffae8,
                 (int *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0));
      ByteMapBuilder::~ByteMapBuilder
                ((ByteMapBuilder *)
                 CONCAT17(in_stack_fffffffffffffad7,
                          CONCAT16(in_stack_fffffffffffffad6,
                                   CONCAT15(in_stack_fffffffffffffad5,
                                            CONCAT14(in_stack_fffffffffffffad4,
                                                     in_stack_fffffffffffffad0)))));
      return;
    }
    local_480 = inst((Prog *)CONCAT17(in_stack_fffffffffffffad7,
                                      CONCAT16(in_stack_fffffffffffffad6,
                                               CONCAT15(in_stack_fffffffffffffad5,
                                                        CONCAT14(in_stack_fffffffffffffad4,
                                                                 in_stack_fffffffffffffad0)))),
                     in_stack_fffffffffffffacc);
    IVar4 = Inst::opcode(local_480);
    if (IVar4 == kInstByteRange) {
      local_484 = Inst::lo(local_480);
      local_488 = Inst::hi(local_480);
      ByteMapBuilder::Mark
                ((ByteMapBuilder *)
                 CONCAT17(in_stack_fffffffffffffad7,
                          CONCAT16(in_stack_fffffffffffffad6,
                                   CONCAT15(in_stack_fffffffffffffad5,
                                            CONCAT14(in_stack_fffffffffffffad4,
                                                     in_stack_fffffffffffffad0)))),
                 in_stack_fffffffffffffacc,in_stack_fffffffffffffac8);
      iVar5 = Inst::foldcase(local_480);
      if (((iVar5 != 0) && (local_484 < 0x7b)) && (0x60 < local_488)) {
        local_48c = local_484;
        local_490 = local_488;
        if (local_484 < 0x61) {
          local_48c = 0x61;
        }
        if (0x7a < local_488) {
          local_490 = 0x7a;
        }
        if (local_48c <= local_490) {
          local_48c = local_48c + -0x20;
          local_490 = local_490 + -0x20;
          ByteMapBuilder::Mark
                    ((ByteMapBuilder *)
                     CONCAT17(in_stack_fffffffffffffad7,
                              CONCAT16(in_stack_fffffffffffffad6,
                                       CONCAT15(in_stack_fffffffffffffad5,
                                                CONCAT14(in_stack_fffffffffffffad4,
                                                         in_stack_fffffffffffffad0)))),
                     in_stack_fffffffffffffacc,in_stack_fffffffffffffac8);
        }
      }
      in_stack_fffffffffffffb04 = Inst::last(local_480);
      if (in_stack_fffffffffffffb04 == 0) {
        this_00 = inst((Prog *)CONCAT17(in_stack_fffffffffffffad7,
                                        CONCAT16(in_stack_fffffffffffffad6,
                                                 CONCAT15(in_stack_fffffffffffffad5,
                                                          CONCAT14(in_stack_fffffffffffffad4,
                                                                   in_stack_fffffffffffffad0)))),
                       in_stack_fffffffffffffacc);
        in_stack_fffffffffffffaf4 = Inst::opcode(this_00);
        if (in_stack_fffffffffffffaf4 == kInstByteRange) {
          in_stack_fffffffffffffaf0 = Inst::out(local_480);
          in_stack_fffffffffffffae8 =
               inst((Prog *)CONCAT17(in_stack_fffffffffffffad7,
                                     CONCAT16(in_stack_fffffffffffffad6,
                                              CONCAT15(in_stack_fffffffffffffad5,
                                                       CONCAT14(in_stack_fffffffffffffad4,
                                                                in_stack_fffffffffffffad0)))),
                    in_stack_fffffffffffffacc);
          in_stack_fffffffffffffae4 = Inst::out(in_stack_fffffffffffffae8);
          if (in_stack_fffffffffffffaf0 == in_stack_fffffffffffffae4) goto LAB_00256944;
        }
      }
      ByteMapBuilder::Merge
                ((ByteMapBuilder *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    }
    else {
      in_stack_fffffffffffffae0 = Inst::opcode(local_480);
      if (in_stack_fffffffffffffae0 == kInstEmptyWidth) {
        EVar6 = Inst::empty(local_480);
        if (((EVar6 & (kEmptyEndLine|kEmptyBeginLine)) != 0) && ((local_461 & 1) == 0)) {
          ByteMapBuilder::Mark
                    ((ByteMapBuilder *)
                     CONCAT17(in_stack_fffffffffffffad7,
                              CONCAT16(in_stack_fffffffffffffad6,
                                       CONCAT15(in_stack_fffffffffffffad5,
                                                CONCAT14(in_stack_fffffffffffffad4,
                                                         in_stack_fffffffffffffad0)))),
                     in_stack_fffffffffffffacc,in_stack_fffffffffffffac8);
          ByteMapBuilder::Merge
                    ((ByteMapBuilder *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00)
                    );
          local_461 = 1;
        }
        EVar6 = Inst::empty(local_480);
        if (((EVar6 & (kEmptyNonWordBoundary|kEmptyWordBoundary)) != 0) && ((local_462 & 1) == 0)) {
          local_4aa[0] = true;
          local_4aa[1] = false;
          local_4a8._M_array = local_4aa;
          local_4a8._M_len = 2;
          local_498 = &local_4a8;
          local_4b8 = std::initializer_list<bool>::begin(local_498);
          pbVar7 = std::initializer_list<bool>::end
                             ((initializer_list<bool> *)
                              CONCAT17(in_stack_fffffffffffffad7,
                                       CONCAT16(in_stack_fffffffffffffad6,
                                                CONCAT15(in_stack_fffffffffffffad5,
                                                         CONCAT14(in_stack_fffffffffffffad4,
                                                                  in_stack_fffffffffffffad0)))));
          for (; local_4b8 != pbVar7; local_4b8 = local_4b8 + 1) {
            bVar1 = *local_4b8;
            local_4cc = 0;
            while (local_4c8 = local_4cc, local_4cc < 0x100) {
              do {
                local_4c8 = local_4c8 + 1;
                in_stack_fffffffffffffad7 = false;
                if (local_4c8 < 0x100) {
                  in_stack_fffffffffffffad6 = IsWordChar((uint8_t)local_4cc);
                  in_stack_fffffffffffffad0 = (uint)(byte)in_stack_fffffffffffffad6;
                  in_stack_fffffffffffffad5 = IsWordChar((uint8_t)local_4c8);
                  in_stack_fffffffffffffad7 =
                       in_stack_fffffffffffffad0 == (byte)in_stack_fffffffffffffad5;
                }
              } while ((bool)in_stack_fffffffffffffad7 != false);
              bVar2 = IsWordChar((uint8_t)local_4cc);
              in_stack_fffffffffffffacc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffacc);
              if (bVar2 == (bool)(bVar1 & 1U)) {
                ByteMapBuilder::Mark
                          ((ByteMapBuilder *)
                           CONCAT17(in_stack_fffffffffffffad7,
                                    CONCAT16(in_stack_fffffffffffffad6,
                                             CONCAT15(in_stack_fffffffffffffad5,
                                                      CONCAT14(in_stack_fffffffffffffad4,
                                                               in_stack_fffffffffffffad0)))),
                           in_stack_fffffffffffffacc,in_stack_fffffffffffffac8);
              }
              local_4cc = local_4c8;
            }
            ByteMapBuilder::Merge
                      ((ByteMapBuilder *)
                       CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
          }
          local_462 = 1;
        }
      }
    }
LAB_00256944:
    local_468 = local_468 + 1;
  } while( true );
}

Assistant:

void Prog::ComputeByteMap() {
  // Fill in bytemap with byte classes for the program.
  // Ranges of bytes that are treated indistinguishably
  // will be mapped to a single byte class.
  ByteMapBuilder builder;

  // Don't repeat the work for ^ and $.
  bool marked_line_boundaries = false;
  // Don't repeat the work for \b and \B.
  bool marked_word_boundaries = false;

  for (int id = 0; id < size(); id++) {
    Inst* ip = inst(id);
    if (ip->opcode() == kInstByteRange) {
      int lo = ip->lo();
      int hi = ip->hi();
      builder.Mark(lo, hi);
      if (ip->foldcase() && lo <= 'z' && hi >= 'a') {
        int foldlo = lo;
        int foldhi = hi;
        if (foldlo < 'a')
          foldlo = 'a';
        if (foldhi > 'z')
          foldhi = 'z';
        if (foldlo <= foldhi) {
          foldlo += 'A' - 'a';
          foldhi += 'A' - 'a';
          builder.Mark(foldlo, foldhi);
        }
      }
      // If this Inst is not the last Inst in its list AND the next Inst is
      // also a ByteRange AND the Insts have the same out, defer the merge.
      if (!ip->last() &&
          inst(id+1)->opcode() == kInstByteRange &&
          ip->out() == inst(id+1)->out())
        continue;
      builder.Merge();
    } else if (ip->opcode() == kInstEmptyWidth) {
      if (ip->empty() & (kEmptyBeginLine|kEmptyEndLine) &&
          !marked_line_boundaries) {
        builder.Mark('\n', '\n');
        builder.Merge();
        marked_line_boundaries = true;
      }
      if (ip->empty() & (kEmptyWordBoundary|kEmptyNonWordBoundary) &&
          !marked_word_boundaries) {
        // We require two batches here: the first for ranges that are word
        // characters, the second for ranges that are not word characters.
        for (bool isword : {true, false}) {
          int j;
          for (int i = 0; i < 256; i = j) {
            for (j = i + 1; j < 256 &&
                            Prog::IsWordChar(static_cast<uint8_t>(i)) ==
                                Prog::IsWordChar(static_cast<uint8_t>(j));
                 j++)
              ;
            if (Prog::IsWordChar(static_cast<uint8_t>(i)) == isword)
              builder.Mark(i, j - 1);
          }
          builder.Merge();
        }
        marked_word_boundaries = true;
      }
    }
  }

  builder.Build(bytemap_, &bytemap_range_);

  if (0) {  // For debugging, use trivial bytemap.
    LOG(ERROR) << "Using trivial bytemap.";
    for (int i = 0; i < 256; i++)
      bytemap_[i] = static_cast<uint8_t>(i);
    bytemap_range_ = 256;
  }
}